

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_fprintf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_user_func *pjVar1;
  io_private *piVar2;
  jx9_io_stream *pjVar3;
  jx9_int64 jVar4;
  char *pcVar5;
  jx9_value *pObj;
  jx9_vm *pVm;
  int nLen;
  fprintf_data sFdata;
  
  if (((nArg < 2) || (((*apArg)->iFlags & 0x100) == 0)) || ((apArg[1]->iFlags & 1) == 0)) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar5 = "Invalid arguments";
LAB_0013e8c6:
    jx9VmThrowError(pVm,&pjVar1->sName,2,pcVar5);
  }
  else {
    piVar2 = (io_private *)((*apArg)->x).pOther;
    if ((piVar2 == (io_private *)0x0) || (piVar2->iMagic != 0xfeac14)) {
      pjVar1 = pCtx->pFunc;
      pVm = pCtx->pVm;
      pcVar5 = "Expecting an IO handle";
      goto LAB_0013e8c6;
    }
    pjVar3 = piVar2->pStream;
    if (pjVar3 == (jx9_io_stream *)0x0) {
      pcVar5 = "null_stream";
LAB_0013e9b6:
      jx9_context_throw_error_format
                (pCtx,2,"IO routine(%s) not implemented in the underlying stream(%s) device",
                 (pCtx->pFunc->sName).zString,pcVar5);
    }
    else {
      if (pjVar3->xWrite == (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0) {
        pcVar5 = pjVar3->zName;
        goto LAB_0013e9b6;
      }
      pcVar5 = jx9_value_to_string(apArg[1],&nLen);
      if (0 < nLen) {
        sFdata.nCount = 0;
        sFdata.pIO = piVar2;
        jx9InputFormat(fprintfConsumer,pCtx,pcVar5,nLen,nArg + -1,apArg + 1,&sFdata,0);
        jVar4 = sFdata.nCount;
        pObj = pCtx->pRet;
        jx9MemObjRelease(pObj);
        (pObj->x).iVal = jVar4;
        goto LAB_0013e8e3;
      }
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
LAB_0013e8e3:
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_fprintf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	fprintf_data sFdata;
	const char *zFormat;
	io_private *pDev;
	int nLen;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) || !jx9_value_is_string(apArg[1]) ){
		/* Missing/Invalid arguments, return zero */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Invalid arguments");
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	if( pDev->pStream == 0  || pDev->pStream->xWrite == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device", 
			jx9_function_name(pCtx), pDev->pStream ? pDev->pStream->zName : "null_stream"
			);
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[1], &nLen);
	if( nLen < 1 ){
		/* Empty string, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Prepare our private data */
	sFdata.nCount = 0;
	sFdata.pIO = pDev;
	/* Format the string */
	jx9InputFormat(fprintfConsumer, pCtx, zFormat, nLen, nArg - 1, &apArg[1], (void *)&sFdata, FALSE);
	/* Return total number of bytes written */
	jx9_result_int64(pCtx, sFdata.nCount);
	return JX9_OK;
}